

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * google::protobuf::io::anon_unknown_1::CopyCordToArray(Cord *cord,uint8_t *target)

{
  CordRepBtree **this;
  bool bVar1;
  const_pointer __src;
  size_type sVar2;
  undefined1 local_168 [8];
  string_view sv;
  ChunkIterator __end3;
  ChunkIterator __begin3;
  ChunkRange *__range3;
  uint8_t *target_local;
  Cord *cord_local;
  
  __begin3.btree_reader_.navigator_.node_[0xb] =
       (CordRepBtree *)absl::lts_20240722::Cord::Chunks(cord);
  this = __begin3.btree_reader_.navigator_.node_ + 0xb;
  absl::lts_20240722::Cord::ChunkRange::begin
            ((ChunkIterator *)(__end3.btree_reader_.navigator_.node_ + 0xb),(ChunkRange *)this);
  absl::lts_20240722::Cord::ChunkRange::end((ChunkIterator *)&sv._M_str,(ChunkRange *)this);
  __range3 = (ChunkRange *)target;
  while( true ) {
    bVar1 = absl::lts_20240722::Cord::ChunkIterator::operator!=
                      ((ChunkIterator *)(__end3.btree_reader_.navigator_.node_ + 0xb),
                       (ChunkIterator *)&sv._M_str);
    if (!bVar1) break;
    _local_168 = absl::lts_20240722::Cord::ChunkIterator::operator*
                           ((ChunkIterator *)(__end3.btree_reader_.navigator_.node_ + 0xb));
    __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_168);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_168);
    memcpy(__range3,__src,sVar2);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_168);
    __range3 = (ChunkRange *)((long)&__range3->cord_ + sVar2);
    absl::lts_20240722::Cord::ChunkIterator::operator++
              ((ChunkIterator *)(__end3.btree_reader_.navigator_.node_ + 0xb));
  }
  return (uint8_t *)__range3;
}

Assistant:

inline uint8_t* CopyCordToArray(const absl::Cord& cord, uint8_t* target) {
  for (absl::string_view sv : cord.Chunks()) {
    memcpy(target, sv.data(), sv.size());
    target += sv.size();
  }
  return target;
}